

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.c
# Opt level: O0

config_value * config_value_duplicate(config_value *value)

{
  long lVar1;
  anon_union_8_4_a3489a58_for_data aVar2;
  undefined4 uVar3;
  config_array *pcVar4;
  char *pcVar5;
  config_value *new_value;
  config_value *value_local;
  
  value_local = (config_value *)malloc(0x10);
  if (value_local == (config_value *)0x0) {
    return (config_value *)0x0;
  }
  uVar3 = *(undefined4 *)&value->field_0x4;
  aVar2 = value->data;
  value_local->type = value->type;
  *(undefined4 *)&value_local->field_0x4 = uVar3;
  value_local->data = aVar2;
  switch(value->type) {
  case ARRAY:
    pcVar4 = config_array_duplicate((value->data).array);
    (value_local->data).array = pcVar4;
    lVar1 = (value_local->data).number;
    break;
  case BOOLEAN:
    (value_local->data).boolean = (_Bool)((value->data).boolean & 1);
    return value_local;
  case NUMBER:
    value_local->data = value->data;
    return value_local;
  case STRING:
    pcVar5 = string_init((value->data).string);
    (value_local->data).string = pcVar5;
    lVar1 = (value_local->data).number;
    break;
  default:
    goto switchD_0010a4d1_default;
  }
  if (lVar1 == 0) {
switchD_0010a4d1_default:
    free(value_local);
    value_local = (config_value *)0x0;
  }
  return value_local;
}

Assistant:

struct config_value *config_value_duplicate(const struct config_value *value)
{
        struct config_value *new_value = malloc(sizeof(struct config_value));

        if (new_value == NULL) {
                return NULL;
        }

        memcpy(new_value, value, sizeof(struct config_value));

        switch (value->type) {
        case ARRAY:
                new_value->data.array = config_array_duplicate(value->data.array);

                if (new_value->data.array == NULL) {
                        goto free_and_error;
                }

                break;
        case BOOLEAN:
                new_value->data.boolean = value->data.boolean;

                break;
        case STRING:
                new_value->data.string = string_init(value->data.string);

                if (new_value->data.string == NULL) {
                        goto free_and_error;
                }

                break;
        case NUMBER:
                new_value->data.number = value->data.number;

                break;
        default:
                goto free_and_error;
        }

        return new_value;

free_and_error:
        free(new_value);

        return NULL;
}